

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O0

void luaL_traceback(lua_State *L,lua_State *L1,char *msg,int level)

{
  int iVar1;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  lua_State *in_RDI;
  GCfunc *fn;
  lua_Debug ar;
  int lim;
  int top;
  char *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  lua_Debug *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  lua_State *in_stack_ffffffffffffff78;
  uint local_78;
  uint local_70;
  undefined1 auStack_68 [60];
  int local_2c;
  int local_24;
  int local_20;
  int local_1c;
  long local_10;
  lua_State *local_8;
  
  local_20 = (int)((long)in_RDI->top - (long)in_RDI->base >> 3);
  local_24 = 0xc;
  local_1c = in_ECX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (in_RDX != 0) {
    lua_pushfstring(in_RDI,"%s\n",in_RDX);
  }
  lua_pushlstring(in_stack_ffffffffffffff78,
                  (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                  (size_t)in_stack_ffffffffffffff68);
  while( true ) {
    local_1c = local_1c + 1;
    iVar1 = lua_getstack(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                         in_stack_ffffffffffffff68);
    if (iVar1 == 0) break;
    if (local_24 < local_1c) {
      iVar1 = lua_getstack(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                           in_stack_ffffffffffffff68);
      if (iVar1 == 0) {
        local_1c = local_1c + -1;
      }
      else {
        lua_pushlstring(in_stack_ffffffffffffff78,
                        (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        (size_t)in_stack_ffffffffffffff68);
        lua_getstack(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
        local_1c = local_2c + -10;
      }
      local_24 = 0x7fffffff;
    }
    else {
      lua_getinfo((lua_State *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                  in_stack_ffffffffffffff58,(lua_Debug *)0x118126);
      in_stack_ffffffffffffff58 = (char *)(ulong)*(uint *)(*(long *)(local_10 + 0x18) + -8);
      *(long *)(local_10 + 0x18) = *(long *)(local_10 + 0x18) + -8;
      if (((byte)in_stack_ffffffffffffff58[6] < 2) ||
         (*(char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70) != '\0')) {
        lua_pushfstring(local_8,"\n\t%s:",auStack_68);
      }
      else {
        lua_pushfstring(local_8,"\n\t[builtin#%d]:",(ulong)(byte)in_stack_ffffffffffffff58[6]);
      }
      if (0 < (int)local_78) {
        lua_pushfstring(local_8,"%d:",(ulong)local_78);
      }
      if (*(char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70) == '\0') {
        if ((char)(in_stack_ffffffffffffff78->nextgc).gcptr32 == 'm') {
          lua_pushlstring(in_stack_ffffffffffffff78,
                          (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                          (size_t)in_stack_ffffffffffffff68);
        }
        else if ((char)(in_stack_ffffffffffffff78->nextgc).gcptr32 == 'C') {
          lua_pushfstring(local_8," at %p",*(undefined8 *)(in_stack_ffffffffffffff58 + 0x18));
        }
        else {
          lua_pushfstring(local_8," in function <%s:%d>",auStack_68,(ulong)local_70);
        }
      }
      else {
        lua_pushfstring(local_8," in function \'%s\'",in_stack_ffffffffffffff68);
      }
      if (0xe < (int)((long)local_8->top - (long)local_8->base >> 3) - local_20) {
        lua_concat((lua_State *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
      }
    }
  }
  lua_concat((lua_State *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
  return;
}

Assistant:

LUALIB_API void luaL_traceback (lua_State *L, lua_State *L1, const char *msg,
				int level)
{
  int top = (int)(L->top - L->base);
  int lim = TRACEBACK_LEVELS1;
  lua_Debug ar;
  if (msg) lua_pushfstring(L, "%s\n", msg);
  lua_pushliteral(L, "stack traceback:");
  while (lua_getstack(L1, level++, &ar)) {
    GCfunc *fn;
    if (level > lim) {
      if (!lua_getstack(L1, level + TRACEBACK_LEVELS2, &ar)) {
	level--;
      } else {
	lua_pushliteral(L, "\n\t...");
	lua_getstack(L1, -10, &ar);
	level = ar.i_ci - TRACEBACK_LEVELS2;
      }
      lim = 2147483647;
      continue;
    }
    lua_getinfo(L1, "Snlf", &ar);
    fn = funcV(L1->top-1); L1->top--;
    if (isffunc(fn) && !*ar.namewhat)
      lua_pushfstring(L, "\n\t[builtin#%d]:", fn->c.ffid);
    else
      lua_pushfstring(L, "\n\t%s:", ar.short_src);
    if (ar.currentline > 0)
      lua_pushfstring(L, "%d:", ar.currentline);
    if (*ar.namewhat) {
      lua_pushfstring(L, " in function " LUA_QS, ar.name);
    } else {
      if (*ar.what == 'm') {
	lua_pushliteral(L, " in main chunk");
      } else if (*ar.what == 'C') {
	lua_pushfstring(L, " at %p", fn->c.f);
      } else {
	lua_pushfstring(L, " in function <%s:%d>",
			ar.short_src, ar.linedefined);
      }
    }
    if ((int)(L->top - L->base) - top >= 15)
      lua_concat(L, (int)(L->top - L->base) - top);
  }
  lua_concat(L, (int)(L->top - L->base) - top);
}